

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_ManRenum(int nVars,uint *pTable,int *pnClasses)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar1 = 1;
  do {
    uVar2 = uVar1 - 1;
    uVar4 = pTable[uVar2];
    if (uVar2 == uVar4) {
      uVar3 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    else {
      if (uVar2 <= uVar4) {
        __assert_fail("pTable[i] < i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                      ,0x153,"void Dtt_ManRenum(int, unsigned int *, int *)");
      }
      uVar3 = (ulong)pTable[uVar4];
    }
    uVar4 = uVar1 >> (~(byte)(-1 << ((byte)nVars & 0x1f)) & 0x1f);
    pTable[uVar2] = (uint)uVar3;
    uVar1 = uVar1 + 1;
  } while (uVar4 == 0);
  printf("The total number of NPN classes = %d.\n",uVar5);
  *pnClasses = (int)uVar5;
  return;
}

Assistant:

void Dtt_ManRenum( int nVars, unsigned * pTable, int * pnClasses )
{
    unsigned i, Limit = 1 << ((1 << nVars)-1), Count = 0;
    for ( i = 0; i < Limit; i++ )
        if ( pTable[i] == i )
            pTable[i] = Count++;
        else 
        {
            assert( pTable[i] < i );
            pTable[i] = pTable[pTable[i]];
        }
    printf( "The total number of NPN classes = %d.\n", Count );
    *pnClasses = Count;
}